

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O2

int bconcat(bstring b0,bstring b1)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  bstring b;
  uchar *puVar5;
  int len;
  
  if (b1 == (bstring)0x0 || b0 == (bstring)0x0) {
    return -1;
  }
  puVar5 = b0->data;
  if (puVar5 == (uchar *)0x0) {
    return -1;
  }
  if (b1->data == (uchar *)0x0) {
    return -1;
  }
  uVar1 = b0->slen;
  uVar2 = b1->slen;
  iVar3 = b0->mlen;
  if ((int)(iVar3 - uVar1 | uVar1 | uVar2) < 0) {
    return -1;
  }
  len = uVar2 + uVar1 + 1;
  b = b1;
  if (iVar3 <= len) {
    lVar4 = (long)b1->data - (long)puVar5;
    if ((lVar4 < iVar3 && -1 < lVar4) && (b = bstrcpy(b1), b == (bstring)0x0)) {
      return -1;
    }
    iVar3 = balloc(b0,len);
    if (iVar3 != 0) {
      iVar3 = -1;
      goto LAB_0010ee5c;
    }
    puVar5 = b0->data;
  }
  if (0 < (int)uVar2) {
    memmove(puVar5 + (int)uVar1,b->data,(ulong)uVar2);
    puVar5 = b0->data;
  }
  puVar5[(int)(uVar2 + uVar1)] = '\0';
  b0->slen = b0->slen + uVar2;
  iVar3 = 0;
LAB_0010ee5c:
  if (b != b1) {
    bdestroy(b);
  }
  return iVar3;
}

Assistant:

int bconcat (bstring b0, const bstring b1) {
int len, d;
bstring aux = b1;

	if (b0 == NULL || b1 == NULL || b0->data == NULL || b1->data == NULL) return BSTR_ERR;

	d = b0->slen;
	len = b1->slen;
	if ((d | (b0->mlen - d) | len) < 0) return BSTR_ERR;

	if (b0->mlen <= d + len + 1) {
		ptrdiff_t pd;
		if (0 <= (pd = b1->data - b0->data) && pd < b0->mlen) {
			if (NULL == (aux = bstrcpy (b1))) return BSTR_ERR;
		}
		if (balloc (b0, d + len + 1) != BSTR_OK) {
			if (aux != b1) bdestroy (aux);
			return BSTR_ERR;
		}
	}

	bBlockCopy (&b0->data[d], &aux->data[0], len);
	b0->data[d + len] = (unsigned char) '\0';
	b0->slen += len;
	if (aux != b1) bdestroy (aux);
	return 0;
}